

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridLocalPolynomial.cpp
# Opt level: O0

void __thiscall
TasGrid::GridLocalPolynomial::applyTransformationTransposed<1,(TasGrid::RuleLocal::erule)3>
          (GridLocalPolynomial *this,double *weights,MultiIndexSet *work,
          vector<int,_std::allocator<int>_> *active_points)

{
  allocator<int> *paVar1;
  allocator<bool> *this_00;
  value_type vVar2;
  pointer this_01;
  int iVar3;
  int iVar4;
  size_type __n;
  int *piVar5;
  const_reference pvVar6;
  reference pvVar7;
  int *piVar8;
  reference pvVar9;
  double dVar10;
  iterator iVar11;
  reference rVar12;
  _Bit_iterator __first;
  _Bit_iterator __last;
  bool local_27d;
  Data2D<int> *local_1f0;
  reference local_1d0;
  int local_1c0;
  int local_1bc;
  int d;
  int j_2;
  double basis_value;
  int *func;
  _Bit_type local_1a0;
  int local_194;
  int local_190;
  int branch;
  int current;
  uint local_180;
  _Bit_type *local_178;
  uint local_170;
  _Bit_type *local_168;
  uint local_160;
  _Bit_type *local_158;
  uint local_150;
  int local_144;
  int *piStack_140;
  int j_1;
  int *pnt;
  size_t i_1;
  int l;
  vector<double,_std::allocator<double>_> node;
  int max_parents;
  vector<bool,_std::allocator<bool>_> used;
  undefined1 local_d8 [8];
  vector<int,_std::allocator<int>_> monkey_tail;
  undefined1 local_b8 [8];
  vector<int,_std::allocator<int>_> monkey_count;
  int j;
  int current_level;
  int *p;
  size_t i;
  int active_top_level;
  allocator<int> local_71;
  undefined1 local_70 [8];
  vector<int,_std::allocator<int>_> level;
  Data2D<int> *dagUp;
  Data2D<int> lparents;
  vector<int,_std::allocator<int>_> *active_points_local;
  MultiIndexSet *work_local;
  double *weights_local;
  GridLocalPolynomial *this_local;
  
  lparents.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)active_points;
  iVar3 = Data2D<int>::getNumStrips(&this->parents);
  iVar4 = MultiIndexSet::getNumIndexes(work);
  if (iVar3 == iVar4) {
    Data2D<int>::Data2D((Data2D<int> *)&dagUp);
  }
  else {
    HierarchyManipulations::computeDAGup<(TasGrid::RuleLocal::erule)3>((Data2D<int> *)&dagUp,work);
  }
  iVar3 = Data2D<int>::getNumStrips(&this->parents);
  iVar4 = MultiIndexSet::getNumIndexes(work);
  if (iVar3 == iVar4) {
    local_1f0 = &this->parents;
  }
  else {
    local_1f0 = (Data2D<int> *)&dagUp;
  }
  level.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_1f0;
  __n = ::std::vector<int,_std::allocator<int>_>::size
                  ((vector<int,_std::allocator<int>_> *)
                   lparents.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
  ::std::allocator<int>::allocator(&local_71);
  ::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_70,__n,&local_71);
  ::std::allocator<int>::~allocator(&local_71);
  i._0_4_ = 0;
  for (p = (int *)0x0;
      piVar5 = (int *)::std::vector<int,_std::allocator<int>_>::size
                                ((vector<int,_std::allocator<int>_> *)
                                 lparents.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage), p < piVar5;
      p = (int *)((long)p + 1)) {
    pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)
                        lparents.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,(size_type)p);
    piVar5 = MultiIndexSet::getIndex(work,*pvVar6);
    monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = RuleLocal::getLevel<(TasGrid::RuleLocal::erule)3>(*piVar5);
    for (monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._0_4_ = 1;
        iVar3 = monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_,
        (int)monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage <
        (this->super_BaseCanonicalGrid).num_dimensions;
        monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._0_4_ =
             (int)monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage + 1) {
      iVar3 = RuleLocal::getLevel<(TasGrid::RuleLocal::erule)3>
                        (piVar5[(int)monkey_count.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage]);
      monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage._4_4_ =
           iVar3 + monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage._4_4_;
    }
    if ((int)i < monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_) {
      i._0_4_ = monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_;
    }
    pvVar7 = ::std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_70,(size_type)p);
    *pvVar7 = iVar3;
  }
  iVar3 = this->top_level;
  paVar1 = (allocator<int> *)
           ((long)&monkey_tail.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  ::std::allocator<int>::allocator(paVar1);
  ::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_b8,(long)(iVar3 + 1),paVar1);
  ::std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&monkey_tail.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  iVar3 = this->top_level;
  paVar1 = (allocator<int> *)
           ((long)&used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_end_of_storage + 7);
  ::std::allocator<int>::allocator(paVar1);
  ::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_d8,(long)(iVar3 + 1),paVar1);
  ::std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&used.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage + 7));
  iVar3 = MultiIndexSet::getNumIndexes(work);
  this_00 = (allocator<bool> *)
            ((long)&node.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage + 7);
  ::std::allocator<bool>::allocator(this_00);
  ::std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&max_parents,(long)iVar3,this_00);
  ::std::allocator<bool>::~allocator
            ((allocator<bool> *)
             ((long)&node.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  iVar3 = RuleLocal::getMaxNumParents<(TasGrid::RuleLocal::erule)3>();
  node.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = iVar3 * (this->super_BaseCanonicalGrid).num_dimensions;
  iVar3 = (this->super_BaseCanonicalGrid).num_dimensions;
  ::std::allocator<double>::allocator((allocator<double> *)((long)&i_1 + 7));
  ::std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&l,(long)iVar3,
             (allocator<double> *)((long)&i_1 + 7));
  ::std::allocator<double>::~allocator((allocator<double> *)((long)&i_1 + 7));
  for (i_1._0_4_ = (int)i; 0 < (int)i_1; i_1._0_4_ = (int)i_1 + -1) {
    pnt = (int *)0x0;
    while( true ) {
      piVar5 = pnt;
      piVar8 = (int *)::std::vector<int,_std::allocator<int>_>::size
                                ((vector<int,_std::allocator<int>_> *)
                                 lparents.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage);
      if (piVar8 <= piVar5) break;
      pvVar7 = ::std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_70,(size_type)pnt);
      if (*pvVar7 == (int)i_1) {
        pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)
                            lparents.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,(size_type)pnt);
        piStack_140 = MultiIndexSet::getIndex(work,*pvVar6);
        for (local_144 = 0; local_144 < (this->super_BaseCanonicalGrid).num_dimensions;
            local_144 = local_144 + 1) {
          dVar10 = RuleLocal::getNode<(TasGrid::RuleLocal::erule)3>(piStack_140[local_144]);
          pvVar9 = ::std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)&l,(long)local_144);
          *pvVar9 = dVar10;
        }
        iVar11 = ::std::vector<bool,_std::allocator<bool>_>::begin
                           ((vector<bool,_std::allocator<bool>_> *)&max_parents);
        local_168 = iVar11.super__Bit_iterator_base._M_p;
        local_160 = iVar11.super__Bit_iterator_base._M_offset;
        local_158 = local_168;
        local_150 = local_160;
        iVar11 = ::std::vector<bool,_std::allocator<bool>_>::end
                           ((vector<bool,_std::allocator<bool>_> *)&max_parents);
        _current = iVar11.super__Bit_iterator_base._M_p;
        local_180 = iVar11.super__Bit_iterator_base._M_offset;
        branch._3_1_ = 0;
        __first.super__Bit_iterator_base._M_offset = local_150;
        __first.super__Bit_iterator_base._M_p = local_158;
        __first.super__Bit_iterator_base._12_4_ = 0;
        __last.super__Bit_iterator_base._12_4_ = 0;
        __last.super__Bit_iterator_base._M_p =
             (_Bit_type *)SUB128(iVar11.super__Bit_iterator_base._0_12_,0);
        __last.super__Bit_iterator_base._M_offset = SUB124(iVar11.super__Bit_iterator_base._0_12_,8)
        ;
        local_178 = _current;
        local_170 = local_180;
        ::std::fill<std::_Bit_iterator,bool>(__first,__last,(bool *)((long)&branch + 3));
        pvVar7 = ::std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_b8,0);
        *pvVar7 = 0;
        pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)
                            lparents.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,(size_type)pnt);
        vVar2 = *pvVar6;
        pvVar7 = ::std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_d8,0);
        *pvVar7 = vVar2;
        local_190 = 0;
        while( true ) {
          pvVar7 = ::std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_b8,0);
          if ((int)node.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage <= *pvVar7) break;
          pvVar7 = ::std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_b8,(long)local_190);
          this_01 = level.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
          if (*pvVar7 < (int)node.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage) {
            pvVar7 = ::std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)local_d8,(long)local_190);
            piVar5 = Data2D<int>::getStrip((Data2D<int> *)this_01,*pvVar7);
            pvVar7 = ::std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)local_b8,(long)local_190);
            local_194 = piVar5[*pvVar7];
            local_27d = true;
            if (local_194 != -1) {
              rVar12 = ::std::vector<bool,_std::allocator<bool>_>::operator[]
                                 ((vector<bool,_std::allocator<bool>_> *)&max_parents,
                                  (long)local_194);
              local_1a0 = rVar12._M_mask;
              func = (int *)rVar12._M_p;
              local_27d = ::std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&func);
            }
            if (local_27d == false) {
              basis_value = (double)MultiIndexSet::getIndex(work,local_194);
              iVar3 = this->order;
              iVar4 = *(int *)basis_value;
              pvVar9 = ::std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)&l,0);
              _d = RuleLocal::evalRaw<(TasGrid::RuleLocal::erule)3>(iVar3,iVar4,*pvVar9);
              for (local_1bc = 1; local_1bc < (this->super_BaseCanonicalGrid).num_dimensions;
                  local_1bc = local_1bc + 1) {
                iVar3 = this->order;
                iVar4 = *(int *)((long)basis_value + (long)local_1bc * 4);
                pvVar9 = ::std::vector<double,_std::allocator<double>_>::operator[]
                                   ((vector<double,_std::allocator<double>_> *)&l,(long)local_1bc);
                dVar10 = RuleLocal::evalRaw<(TasGrid::RuleLocal::erule)3>(iVar3,iVar4,*pvVar9);
                _d = dVar10 * _d;
              }
              for (local_1c0 = 0; local_1c0 < (this->super_BaseCanonicalGrid).num_dimensions;
                  local_1c0 = local_1c0 + 1) {
                pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                                   ((vector<int,_std::allocator<int>_> *)
                                    lparents.vec.super__Vector_base<int,_std::allocator<int>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage,(size_type)pnt
                                   );
                iVar3 = local_194 * (this->super_BaseCanonicalGrid).num_dimensions + local_1c0;
                weights[iVar3] =
                     -weights[*pvVar6 * (this->super_BaseCanonicalGrid).num_dimensions + local_1c0]
                     * _d + weights[iVar3];
              }
              rVar12 = ::std::vector<bool,_std::allocator<bool>_>::operator[]
                                 ((vector<bool,_std::allocator<bool>_> *)&max_parents,
                                  (long)local_194);
              local_1d0 = rVar12;
              ::std::_Bit_reference::operator=(&local_1d0,true);
              local_190 = local_190 + 1;
              pvVar7 = ::std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)local_b8,(long)local_190);
              iVar3 = local_194;
              *pvVar7 = 0;
              pvVar7 = ::std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)local_d8,(long)local_190);
              *pvVar7 = iVar3;
            }
            else {
              pvVar7 = ::std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)local_b8,(long)local_190);
              *pvVar7 = *pvVar7 + 1;
            }
          }
          else {
            local_190 = local_190 + -1;
            pvVar7 = ::std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)local_b8,(long)local_190);
            *pvVar7 = *pvVar7 + 1;
          }
        }
      }
      pnt = (int *)((long)pnt + 1);
    }
  }
  ::std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&l);
  ::std::vector<bool,_std::allocator<bool>_>::~vector
            ((vector<bool,_std::allocator<bool>_> *)&max_parents);
  ::std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_d8);
  ::std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_b8);
  ::std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_70);
  Data2D<int>::~Data2D((Data2D<int> *)&dagUp);
  return;
}

Assistant:

void GridLocalPolynomial::applyTransformationTransposed(double weights[], const MultiIndexSet &work, const std::vector<int> &active_points) const {
    Data2D<int> lparents = (parents.getNumStrips() != work.getNumIndexes()) ? // if the current dag loaded in parents does not reflect the indexes in work
                            HierarchyManipulations::computeDAGup<effrule>(work) :
                            Data2D<int>();

    const Data2D<int> &dagUp = (parents.getNumStrips() != work.getNumIndexes()) ? lparents : parents;

    std::vector<int> level(active_points.size());
    int active_top_level = 0;
    for(size_t i=0; i<active_points.size(); i++){
        const int *p = work.getIndex(active_points[i]);
        int current_level = RuleLocal::getLevel<effrule>(p[0]);
        for(int j=1; j<num_dimensions; j++){
            current_level += RuleLocal::getLevel<effrule>(p[j]);
        }
        if (active_top_level < current_level) active_top_level = current_level;
        level[i] = current_level;
    }

    std::vector<int> monkey_count(top_level+1);
    std::vector<int> monkey_tail(top_level+1);
    std::vector<bool> used(work.getNumIndexes());
    int max_parents = RuleLocal::getMaxNumParents<effrule>() * num_dimensions;

    std::vector<double> node(num_dimensions);

    for(int l=active_top_level; l>0; l--){
        for(size_t i=0; i<active_points.size(); i++){
            if (level[i] == l){
                int const *pnt = work.getIndex(active_points[i]);
                for(int j=0; j<num_dimensions; j++)
                    node[j] = RuleLocal::getNode<effrule>(pnt[j]);

                std::fill(used.begin(), used.end(), false);

                monkey_count[0] = 0;
                monkey_tail[0] = active_points[i];
                int current = 0;

                while(monkey_count[0] < max_parents){
                    if (monkey_count[current] < max_parents){
                        int branch = dagUp.getStrip(monkey_tail[current])[monkey_count[current]];
                        if ((branch == -1) || used[branch]){
                            monkey_count[current]++;
                        }else{
                            const int *func = work.getIndex(branch);
                            double basis_value = RuleLocal::evalRaw<effrule>(order, func[0], node[0]);
                            for(int j=1; j<num_dimensions; j++) basis_value *= RuleLocal::evalRaw<effrule>(order, func[j], node[j]);

                            if (mode == 0) {
                                weights[branch] -= weights[active_points[i]] * basis_value;
                            } else {
                                for (int d=0; d<num_dimensions; d++)
                                    weights[branch * num_dimensions + d] -=
                                            weights[active_points[i] * num_dimensions + d] * basis_value;
                            }
                            used[branch] = true;

                            monkey_count[++current] = 0;
                            monkey_tail[current] = branch;
                        }
                    }else{
                        monkey_count[--current]++;
                    }
                }
            }
        }
    }
}